

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O0

void cftf040(double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  double *a_local;
  
  dVar1 = *a;
  dVar2 = a[1];
  dVar3 = *a;
  dVar4 = a[4];
  dVar5 = a[1];
  dVar6 = a[5];
  dVar7 = a[2];
  dVar8 = a[3];
  dVar9 = a[2];
  dVar10 = a[6];
  dVar11 = a[3];
  *a = dVar1 + a[4] + dVar7 + a[6];
  a[1] = dVar2 + a[5] + dVar8 + a[7];
  a[2] = (dVar3 - dVar4) - (dVar11 - a[7]);
  a[3] = (dVar5 - dVar6) + (dVar9 - dVar10);
  a[4] = (dVar1 + a[4]) - (dVar7 + a[6]);
  a[5] = (dVar2 + a[5]) - (dVar8 + a[7]);
  a[6] = (dVar3 - dVar4) + (dVar11 - a[7]);
  a[7] = (dVar5 - dVar6) - (dVar9 - dVar10);
  return;
}

Assistant:

void cftf040(FFTFLT *a)
{
    FFTFLT x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    x0r = a[0] + a[4];
    x0i = a[1] + a[5];
    x1r = a[0] - a[4];
    x1i = a[1] - a[5];
    x2r = a[2] + a[6];
    x2i = a[3] + a[7];
    x3r = a[2] - a[6];
    x3i = a[3] - a[7];
    a[0] = x0r + x2r;
    a[1] = x0i + x2i;
    a[2] = x1r - x3i;
    a[3] = x1i + x3r;
    a[4] = x0r - x2r;
    a[5] = x0i - x2i;
    a[6] = x1r + x3i;
    a[7] = x1i - x3r;
}